

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O1

plt_lib plt_get_lib(plt_ctx ctx,char *name)

{
  long lVar1;
  bool bVar2;
  plt_selector pVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  plt_lib in_RCX;
  plt_lib plVar8;
  char *pcVar9;
  undefined1 *puVar10;
  plt_lib plVar11;
  link_map *lib;
  undefined1 auStack_68 [8];
  undefined1 *local_60;
  size_t local_58;
  size_t len;
  plt_lib local_48;
  int local_40;
  plt_selector local_3c;
  plt_lib local_38;
  char *val;
  
  puVar10 = auStack_68;
  if (name == (char *)0x0) {
    plVar11 = ctx->r_map;
  }
  else {
    local_38 = (plt_lib)0x0;
    pVar3 = plt_get_selector(name,(char **)&local_38);
    plVar11 = local_38;
    local_40 = strcmp((char *)local_38,"c");
    lib = ctx->r_map;
    if (lib != (link_map *)0x0) {
      sVar5 = strlen((char *)plVar11);
      local_58 = sVar5 + 8;
      len = sVar5 + 0x17 & 0xfffffffffffffff0;
      local_3c = pVar3;
      do {
        plVar8 = local_38;
        if (pVar3 == PLT_SEL_LIB) {
          local_48 = plVar11;
          *(undefined8 *)(puVar10 + -8) = 0x107f1d;
          pcVar6 = get_lib_name(ctx,lib);
          plVar8 = local_38;
          sVar5 = local_58;
          plVar11 = lib;
          if (local_40 == 0) {
            *(undefined8 *)(puVar10 + -8) = 0x107fb1;
            pcVar9 = strstr(pcVar6,"/libc.so");
            if (pcVar9 == (char *)0x0) {
              *(undefined8 *)(puVar10 + -8) = 0x107fc5;
              pcVar6 = strstr(pcVar6,"/musl.so");
              if (pcVar6 == (char *)0x0) goto LAB_00107f76;
            }
            bVar2 = false;
            plVar8 = in_RCX;
          }
          else {
            lVar1 = -len;
            pcVar9 = puVar10 + lVar1;
            bVar2 = false;
            local_60 = puVar10;
            builtin_strncpy(puVar10 + lVar1 + -8,"S\x7f\x10",4);
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snprintf(pcVar9,sVar5,"/lib%s.so");
            pVar3 = local_3c;
            builtin_strncpy(puVar10 + lVar1 + -8,"e\x7f\x10",4);
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            pcVar6 = strstr(pcVar6,pcVar9);
            in_RCX = plVar8;
            puVar10 = local_60;
            if (pcVar6 == (char *)0x0) {
LAB_00107f76:
              bVar2 = true;
              plVar8 = in_RCX;
              plVar11 = local_48;
            }
          }
          in_RCX = plVar8;
          if (!bVar2) {
            return plVar11;
          }
        }
        else if ((pVar3 & ~PLT_SEL_FILE) == PLT_SEL_NONE) {
          *(undefined8 *)(puVar10 + -8) = 0x107fe6;
          pcVar6 = get_lib_name(ctx,lib);
          plVar8 = local_38;
          *(undefined8 *)(puVar10 + -8) = 0x107ff2;
          iVar4 = strcmp((char *)plVar8,pcVar6);
          if (iVar4 == 0) {
            return lib;
          }
        }
        else if (pVar3 == PLT_SEL_SYM) {
          *(undefined8 *)(puVar10 + -8) = 0x107f98;
          sVar7 = get_offsets((plt_ctx)lib,plVar8,(char *)0x0,(plt_offset **)in_RCX);
          if (sVar7 != 0) {
            return lib;
          }
        }
        lib = lib->l_next;
      } while (lib != (link_map *)0x0);
    }
    plVar11 = (plt_lib)0x0;
  }
  return plVar11;
}

Assistant:

plt_lib plt_get_lib(plt_ctx ctx, const char *name)
{
    if (!name)
        return ctx->r_map;

    const char *val = NULL;
    enum plt_selector sel = plt_get_selector(name, &val);
    size_t val_len = strlen(val);
    int libc = !strcmp(val, "c");

    for (struct link_map *lm = ctx->r_map; lm != NULL; lm = lm->l_next) {
        if (sel == PLT_SEL_LIB) {
            const char *libname = get_lib_name(ctx, lm);
            if (libc) {
                if (strstr(libname, "/libc.so")
                 || strstr(libname, "/musl.so"))
                    return lm;
            } else {
                size_t len = val_len + 8;
                char pattern[len];
                snprintf(pattern, len, "/lib%s.so", val);
                if (strstr(libname, pattern))
                    return lm;
            }
        } else if (sel == PLT_SEL_NONE || sel == PLT_SEL_FILE) {
            const char *libname = get_lib_name(ctx, lm);
            if (!strcmp(val, libname))
                return lm;
        } else if (sel == PLT_SEL_SYM) {
            if (get_offsets(ctx, lm, val, NULL) > 0)
                return lm;
        }
    }
    return NULL;
}